

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O2

void CClient::ConchainWindowScreen
               (IResult *pResult,void *pUserData,FCommandCallback pfnCallback,
               void *pCallbackUserData)

{
  int iVar1;
  int iVar2;
  
  if ((*(long *)((long)pUserData + 0x58) != 0) && (pResult->m_NumArgs != 0)) {
    iVar2 = *(int *)(*(long *)((long)pUserData + 0x90) + 0xe98);
    iVar1 = (*pResult->_vptr_IResult[2])(pResult,0);
    if (iVar2 == iVar1) {
      return;
    }
    iVar2 = (*pResult->_vptr_IResult[2])(pResult,0);
    (**(code **)(*pUserData + 0x68))(pUserData,iVar2);
    return;
  }
  (*pfnCallback)(pResult,pCallbackUserData);
  return;
}

Assistant:

void CClient::ConchainWindowScreen(IConsole::IResult *pResult, void *pUserData, IConsole::FCommandCallback pfnCallback, void *pCallbackUserData)
{
	CClient *pSelf = (CClient *)pUserData;
	if(pSelf->Graphics() && pResult->NumArguments())
	{
		if(pSelf->Config()->m_GfxScreen != pResult->GetInteger(0))
			pSelf->SwitchWindowScreen(pResult->GetInteger(0));
	}
	else
		pfnCallback(pResult, pCallbackUserData);
}